

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

void __thiscall QMakeProperty::unsetProperty(QMakeProperty *this,QStringList *optionProperties)

{
  char cVar1;
  QString *pQVar2;
  QString *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (optionProperties->d).ptr;
  for (pQVar3 = pQVar2; pQVar3 != pQVar2 + (optionProperties->d).size; pQVar3 = pQVar3 + 1) {
    local_50.d = (pQVar3->d).d;
    local_50.ptr = (pQVar3->d).ptr;
    local_50.size = (pQVar3->d).size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::QString((QString *)&local_68,".");
    cVar1 = QString::startsWith((QString *)&local_50,(CaseSensitivity)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (cVar1 == '\0') {
      remove(this,(char *)&local_50);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar2 = (optionProperties->d).ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeProperty::unsetProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        if (!var.startsWith("."))
            remove(var);
    }
}